

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

sunrealtype N_VWL2Norm_Serial(N_Vector x,N_Vector w)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  sunrealtype sVar5;
  
  lVar1 = *x->content;
  if (lVar1 < 1) {
    sVar5 = 0.0;
  }
  else {
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar4 = *(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8) *
              *(double *)(*(long *)((long)w->content + 0x10) + lVar2 * 8);
      dVar3 = dVar3 + dVar4 * dVar4;
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
    sVar5 = 0.0;
    if (0.0 < dVar3) {
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
        return dVar3;
      }
      sVar5 = SQRT(dVar3);
    }
  }
  return sVar5;
}

Assistant:

sunrealtype N_VWL2Norm_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  sunrealtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++)
  {
    prodi = xd[i] * wd[i];
    sum += SUNSQR(prodi);
  }

  return (SUNRsqrt(sum));
}